

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O2

void cmAddLinkDirectoryForTarget(void *arg,char *tgt,char *d)

{
  cmTarget *this;
  string *this_00;
  allocator<char> local_c2;
  allocator<char> local_c1;
  string local_c0;
  undefined1 local_a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,tgt,(allocator<char> *)local_a0);
  this = cmMakefile::FindLocalNonAliasTarget((cmMakefile *)arg,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  if (this == (cmTarget *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,tgt,&local_c1);
    std::operator+(&local_80,"Attempt to add link directories to non-existent target: ",&local_40);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                   &local_80," for directory ");
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,d,&local_c2);
    std::operator+(&local_c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                   &local_60);
    cmSystemTools::Error(&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)local_a0);
    std::__cxx11::string::~string((string *)&local_80);
    this_00 = &local_40;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,d,(allocator<char> *)&local_80);
    cmMakefile::GetBacktrace((cmMakefile *)local_a0);
    cmTarget::InsertLinkDirectory(this,&local_c0,(cmListFileBacktrace *)local_a0,false);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a0 + 8));
    this_00 = &local_c0;
  }
  std::__cxx11::string::~string((string *)this_00);
  return;
}

Assistant:

void CCONV cmAddLinkDirectoryForTarget(void* arg, const char* tgt,
                                       const char* d)
{
  cmMakefile* mf = static_cast<cmMakefile*>(arg);
  cmTarget* t = mf->FindLocalNonAliasTarget(tgt);
  if (!t) {
    cmSystemTools::Error(
      "Attempt to add link directories to non-existent target: " +
      std::string(tgt) + " for directory " + std::string(d));
    return;
  }
  t->InsertLinkDirectory(d, mf->GetBacktrace());
}